

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O2

void dump_matches(int level,matchp mp)

{
  do {
    if (mp == (matchp)0x0) {
      if (G_log_level < level) {
        return;
      }
      G_log_log_level = level;
      log_log_default(" (NULL)\n");
      return;
    }
    if ((mp->offset != 0) && (level <= G_log_level)) {
      G_log_log_level = level;
      log_log_default(" offset %d, len %d\n",(ulong)mp->offset,(ulong)mp->len);
    }
    mp = mp->next;
  } while (mp != (match *)0x0);
  return;
}

Assistant:

void dump_matches(int level, matchp mp)
{
    if (mp == NULL)
    {
        LOG(level, (" (NULL)\n"));
    } else
    {
        if(mp->offset > 0)
        {
            LOG(level, (" offset %d, len %d\n", mp->offset, mp->len));
        }
        if (mp->next != NULL)
        {
            dump_matches(level, mp->next);
        }
    }
}